

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDBusMenuEvent>::copyAppend
          (QGenericArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,QDBusMenuEvent *e)

{
  QDBusMenuEvent *pQVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QDBusMenuEvent>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size;
    do {
      pQVar1[lVar3].m_id = b->m_id;
      pDVar2 = (b->m_eventId).d.d;
      pQVar1[lVar3].m_eventId.d.d = pDVar2;
      pQVar1[lVar3].m_eventId.d.ptr = (b->m_eventId).d.ptr;
      pQVar1[lVar3].m_eventId.d.size = (b->m_eventId).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ::QVariant::QVariant(&pQVar1[lVar3].m_data.m_variant,&(b->m_data).m_variant);
      pQVar1[lVar3].m_timestamp = b->m_timestamp;
      lVar3 = (this->super_QArrayDataPointer<QDBusMenuEvent>).size + 1;
      (this->super_QArrayDataPointer<QDBusMenuEvent>).size = lVar3;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }